

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  byte tag;
  TString *key;
  byte bVar2;
  
  key = luaS_new(L,k);
  tag = 0x30;
  if (t->tt_ == 'E') {
    tag = luaH_getstr((Table *)(t->value_).gc,key,&((L->top).p)->val);
    bVar2 = tag & 0xf;
    if (bVar2 != 0) {
      (L->top).p = (StkId)((L->top).offset + 0x10);
      goto LAB_00107123;
    }
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = key;
  (pSVar1->val).tt_ = key->tt | 0x40;
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  bVar2 = luaV_finishget(L,t,&pSVar1->val,pSVar1,tag);
  bVar2 = bVar2 & 0xf;
LAB_00107123:
  return (int)bVar2;
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  lu_byte tag;
  TString *str = luaS_new(L, k);
  luaV_fastget(t, str, s2v(L->top.p), luaH_getstr, tag);
  if (!tagisempty(tag))
    api_incr_top(L);
  else {
    setsvalue2s(L, L->top.p, str);
    api_incr_top(L);
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  }
  lua_unlock(L);
  return novariant(tag);
}